

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O3

void __thiscall
helics::CommsInterface::setMessageSize(CommsInterface *this,int maxMsgSize,int maxCount)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  
  cVar2 = '\0';
  while( true ) {
    LOCK();
    cVar1 = (this->operating)._M_base._M_i;
    bVar3 = cVar2 == cVar1;
    if (bVar3) {
      (this->operating)._M_base._M_i = true;
      cVar1 = cVar2;
    }
    cVar2 = cVar1;
    UNLOCK();
    if (bVar3) break;
    if ((this->txStatus)._M_i != STARTUP) {
      return;
    }
  }
  if (0 < maxMsgSize) {
    this->maxMessageSize = maxMsgSize;
  }
  if (0 < maxCount) {
    this->maxMessageCount = maxCount;
  }
  LOCK();
  if ((this->operating)._M_base._M_i == true) {
    (this->operating)._M_base._M_i = false;
  }
  UNLOCK();
  return;
}

Assistant:

void CommsInterface::setMessageSize(int maxMsgSize, int maxCount)
{
    if (propertyLock()) {
        if (maxMsgSize > 0) {
            maxMessageSize = maxMsgSize;
        }
        if (maxCount > 0) {
            maxMessageCount = maxCount;
        }
        propertyUnLock();
    }
}